

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_20::
     CompareSortKeys<google::protobuf::FileDescriptor>(FileDescriptor *a,FileDescriptor *b)

{
  bool bVar1;
  string local_58;
  string local_38;
  FileDescriptor *local_18;
  FileDescriptor *b_local;
  FileDescriptor *a_local;
  
  local_18 = b;
  b_local = a;
  GetSortKey<google::protobuf::FileDescriptor>(&local_38,a);
  GetSortKey<google::protobuf::FileDescriptor>(&local_58,local_18);
  bVar1 = std::operator<(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool CompareSortKeys(const T* a, const T* b) {
  return GetSortKey(*a) < GetSortKey(*b);
}